

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChLinkRevoluteTranslational::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevoluteTranslational *this)

{
  ChFrame<double> *this_00;
  undefined1 auVar1 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ChVector<double> p;
  ChQuaternion<double> local_a8;
  undefined1 local_88 [16];
  double local_78;
  ChMatrix33<double> local_70;
  
  this_00 = (ChFrame<double> *)(this->super_ChLink).Body2;
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)&local_70,(ChFrame<double> *)(this->super_ChLink).Body1,&this->m_p1
            );
  ChFrame<double>::TransformPointParentToLocal
            ((ChVector<double> *)local_88,this_00,(ChVector<double> *)&local_70);
  Vcross<double,double>(&this->m_x2,&this->m_y2);
  auVar1._0_24_ = *(undefined1 (*) [24])&this->m_x2;
  auVar1._24_24_ = *(undefined1 (*) [24])&this->m_y2;
  auVar1._48_8_ = this->m_dist;
  auVar1._56_8_ = this->m_cur_par1;
  auVar1 = vinsertf64x4_avx512f
                     (auVar1,*(undefined1 (*) [32])((this->super_ChLink).react_force.m_data + 1),1);
  local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
       vpermi2pd_avx512f(_DAT_00e83940,auVar1,
                         ZEXT1664(CONCAT88(local_a8.m_data[1],local_a8.m_data[0])));
  local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_a8.m_data[2];
  ChMatrix33<double>::Get_A_quaternion(&local_a8,&local_70);
  auVar2._8_8_ = local_78;
  auVar2._0_8_ = local_78;
  auVar2._16_8_ = local_78;
  auVar2._24_8_ = local_78;
  auVar2 = vblendps_avx(ZEXT1632(local_88),auVar2,0x30);
  auVar3._8_8_ = local_a8.m_data[0];
  auVar3._0_8_ = local_a8.m_data[0];
  auVar3._16_8_ = local_a8.m_data[0];
  auVar3._24_8_ = local_a8.m_data[0];
  auVar2 = vblendps_avx(auVar2,auVar3,0xc0);
  __return_storage_ptr__->pos = (ChVector<double>)auVar2._0_24_;
  (__return_storage_ptr__->rot).m_data[0] = (double)auVar2._24_8_;
  (__return_storage_ptr__->rot).m_data[1] = local_a8.m_data[1];
  (__return_storage_ptr__->rot).m_data[2] = local_a8.m_data[2];
  (__return_storage_ptr__->rot).m_data[3] = local_a8.m_data[3];
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkRevoluteTranslational::GetLinkRelativeCoords() {
    // Origin at P1 (center of revolute side) and orientation formed using
    // the mutually orthogonal direction x2 and y2.
    ChVector<> p = Body2->TransformPointParentToLocal(Body1->TransformPointLocalToParent(m_p1));
    ChMatrix33<> A(m_x2, m_y2, Vcross(m_x2, m_y2));

    return ChCoordsys<>(p, A.Get_A_quaternion());
}